

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

EventsPerSock * __thiscall
CConnman::GenerateWaitSockets
          (EventsPerSock *__return_storage_ptr__,CConnman *this,Span<CNode_*const> nodes)

{
  byte bVar1;
  pointer pLVar2;
  undefined8 *puVar3;
  bool bVar4;
  byte bVar5;
  ListenSocket *hListenSocket;
  pointer pLVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock67;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock66;
  unique_lock<std::mutex> local_68;
  long local_50;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  pLVar2 = (this->vhListenSocket).
           super__Vector_base<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pLVar6 = (this->vhListenSocket).
                super__Vector_base<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>.
                _M_impl.super__Vector_impl_data._M_start; pLVar6 != pLVar2; pLVar6 = pLVar6 + 1) {
    local_68._M_device._0_2_ = 1;
    std::
    _Hashtable<std::shared_ptr<Sock_const>,std::pair<std::shared_ptr<Sock_const>const,Sock::Events>,std::allocator<std::pair<std::shared_ptr<Sock_const>const,Sock::Events>>,std::__detail::_Select1st,Sock::EqualSharedPtrSock,Sock::HashSharedPtrSock,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::shared_ptr<Sock>const&,Sock::Events>
              ((_Hashtable<std::shared_ptr<Sock_const>,std::pair<std::shared_ptr<Sock_const>const,Sock::Events>,std::allocator<std::pair<std::shared_ptr<Sock_const>const,Sock::Events>>,std::__detail::_Select1st,Sock::EqualSharedPtrSock,Sock::HashSharedPtrSock,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)__return_storage_ptr__,pLVar6,&local_68);
  }
  for (lVar7 = 0; nodes.m_size << 3 != lVar7; lVar7 = lVar7 + 8) {
    puVar3 = *(undefined8 **)((long)nodes.m_data + lVar7);
    bVar1 = *(byte *)(puVar3 + 0x48);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_48,
               (AnnotatedMixin<std::mutex> *)(puVar3 + 0x10),"pnode->cs_vSend",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
               ,0x7d8,false);
    (**(code **)(*(long *)*puVar3 + 0x38))(&local_68,(long *)*puVar3,puVar3[0xc] != puVar3[8]);
    bVar4 = local_68._M_owns;
    bVar8 = local_50 != 0;
    bVar5 = bVar8 | local_68._M_owns;
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
    if (((bVar1 ^ 1 | bVar5) & 1) != 0) {
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_68,
                 (AnnotatedMixin<std::mutex> *)(puVar3 + 0x15),"pnode->m_sock_mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                 ,0x7e1,false);
      if (puVar3[2] != 0) {
        local_48._M_device._0_1_ = (bVar1 ^ 1) & 1 | (bVar8 | bVar4 & 1U) * '\x02';
        local_48._M_device._1_1_ = 0;
        std::
        _Hashtable<std::shared_ptr<Sock_const>,std::pair<std::shared_ptr<Sock_const>const,Sock::Events>,std::allocator<std::pair<std::shared_ptr<Sock_const>const,Sock::Events>>,std::__detail::_Select1st,Sock::EqualSharedPtrSock,Sock::HashSharedPtrSock,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::shared_ptr<Sock>&,Sock::Events>
                  ((_Hashtable<std::shared_ptr<Sock_const>,std::pair<std::shared_ptr<Sock_const>const,Sock::Events>,std::allocator<std::pair<std::shared_ptr<Sock_const>const,Sock::Events>>,std::__detail::_Select1st,Sock::EqualSharedPtrSock,Sock::HashSharedPtrSock,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)__return_storage_ptr__,puVar3 + 2,&local_48);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Sock::EventsPerSock CConnman::GenerateWaitSockets(Span<CNode* const> nodes)
{
    Sock::EventsPerSock events_per_sock;

    for (const ListenSocket& hListenSocket : vhListenSocket) {
        events_per_sock.emplace(hListenSocket.sock, Sock::Events{Sock::RECV});
    }

    for (CNode* pnode : nodes) {
        bool select_recv = !pnode->fPauseRecv;
        bool select_send;
        {
            LOCK(pnode->cs_vSend);
            // Sending is possible if either there are bytes to send right now, or if there will be
            // once a potential message from vSendMsg is handed to the transport. GetBytesToSend
            // determines both of these in a single call.
            const auto& [to_send, more, _msg_type] = pnode->m_transport->GetBytesToSend(!pnode->vSendMsg.empty());
            select_send = !to_send.empty() || more;
        }
        if (!select_recv && !select_send) continue;

        LOCK(pnode->m_sock_mutex);
        if (pnode->m_sock) {
            Sock::Event event = (select_send ? Sock::SEND : 0) | (select_recv ? Sock::RECV : 0);
            events_per_sock.emplace(pnode->m_sock, Sock::Events{event});
        }
    }

    return events_per_sock;
}